

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O1

void compute_dim_order(int num_dims,int max_dim,int *dim_order)

{
  ulong uVar1;
  
  if (0 < num_dims) {
    uVar1 = 0;
    do {
      dim_order[uVar1] = (uint)((long)max_dim <= (long)uVar1) + (int)uVar1;
      uVar1 = uVar1 + 1;
    } while ((uint)num_dims != uVar1);
  }
  dim_order[(long)num_dims + -1] = max_dim;
  return;
}

Assistant:

void compute_dim_order(int num_dims, int max_dim, int *dim_order) {
  for (int i = 0; i < num_dims; i++) {
	if (i < max_dim) {
	  dim_order[i] = i;
	} else {
	  dim_order[i] = i + 1;
	}
  }
  dim_order[num_dims - 1] = max_dim;
}